

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar3;
  ImVec2 IVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  fVar1 = (window->Pos).x;
  fVar6 = (window->Size).x + fVar1;
  fVar3 = (window->Pos).y;
  fVar7 = (window->Size).y + fVar3;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar6 = fVar6 + -1.0;
    fVar7 = fVar7 + -1.0;
  }
  switch(border_n) {
  case 0:
    fVar4 = fVar1 - thickness;
    fVar5 = fVar3 + perp_padding;
    IVar2.x = fVar1 + thickness;
    IVar2.y = fVar7 - perp_padding;
    break;
  case 1:
    fVar4 = fVar6 - thickness;
    fVar5 = fVar3 + perp_padding;
    IVar2.y = fVar7 - perp_padding;
    IVar2.x = thickness + fVar6;
    break;
  case 2:
    goto LAB_001f9748;
  case 3:
    fVar3 = fVar7;
LAB_001f9748:
    fVar5 = fVar3 - thickness;
    fVar4 = fVar1 + perp_padding;
    IVar2.y = fVar3 + thickness;
    IVar2.x = fVar6 - perp_padding;
    break;
  default:
    fVar4 = 0.0;
    fVar5 = 0.0;
    IVar2.x = 0.0;
    IVar2.y = 0.0;
  }
  IVar8.Min.y = fVar5;
  IVar8.Min.x = fVar4;
  IVar8.Max = IVar2;
  return IVar8;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f)
        rect.Max -= ImVec2(1, 1);
    if (border_n == ImGuiDir_Left)  { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Right) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Up)    { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    }
    if (border_n == ImGuiDir_Down)  { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    }
    IM_ASSERT(0);
    return ImRect();
}